

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

wchar_t critical_shot(player *p,monster *monster,wchar_t weight,wchar_t plus,wchar_t dam,
                     _Bool launched,uint32_t *msg_type)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  bool bVar4;
  critical_level *local_40;
  critical_level *this_l;
  wchar_t power;
  wchar_t new_dam;
  wchar_t chance;
  wchar_t to_h;
  _Bool launched_local;
  wchar_t dam_local;
  wchar_t plus_local;
  wchar_t weight_local;
  monster *monster_local;
  player *p_local;
  
  new_dam = (p->state).to_h + plus;
  _Var1 = is_debuffed(monster);
  if (_Var1) {
    new_dam = z_info->r_crit_debuff_toh + new_dam;
  }
  if (launched) {
    iVar2 = z_info->r_crit_chance_launched_toh_skill_scl * (p->state).skills[7];
  }
  else {
    iVar2 = z_info->r_crit_chance_thrown_toh_skill_scl * (p->state).skills[8];
  }
  power = iVar2 + z_info->r_crit_chance_weight_scl * weight +
                  z_info->r_crit_chance_toh_scl * new_dam +
                  z_info->r_crit_chance_level_scl * (int)p->lev + z_info->r_crit_chance_offset;
  uVar3 = Rand_div(z_info->r_crit_chance_range);
  if ((power < uVar3 + L'\x01') || (z_info->r_crit_level_head == (critical_level *)0x0)) {
    *msg_type = 0x55;
    this_l._4_4_ = dam;
  }
  else {
    iVar2 = z_info->r_crit_power_weight_scl;
    uVar3 = Rand_div(z_info->r_crit_power_random);
    local_40 = z_info->r_crit_level_head;
    while( true ) {
      bVar4 = false;
      if (local_40->cutoff <= iVar2 * weight + uVar3 + 1) {
        bVar4 = local_40->next != (critical_level *)0x0;
      }
      if (!bVar4) break;
      local_40 = local_40->next;
    }
    *msg_type = local_40->msgt;
    this_l._4_4_ = local_40->add + local_40->mult * dam;
  }
  return this_l._4_4_;
}

Assistant:

static int critical_shot(const struct player *p,
		const struct monster *monster,
		int weight, int plus,
		int dam, bool launched, uint32_t *msg_type)
{
	int to_h = p->state.to_h + plus;
	int chance, new_dam;

	if (is_debuffed(monster)) {
		to_h += z_info->r_crit_debuff_toh;
	}
	chance = z_info->r_crit_chance_weight_scl * weight
		+ z_info->r_crit_chance_toh_scl * to_h
		+ z_info->r_crit_chance_level_scl * p->lev
		+ z_info->r_crit_chance_offset;
	if (launched) {
		chance += z_info->r_crit_chance_launched_toh_skill_scl
			* p->state.skills[SKILL_TO_HIT_BOW];
	} else {
		chance += z_info->r_crit_chance_thrown_toh_skill_scl
			* p->state.skills[SKILL_TO_HIT_THROW];
	}

	if (randint1(z_info->r_crit_chance_range) > chance
			|| !z_info->r_crit_level_head) {
		*msg_type = MSG_SHOOT_HIT;
		new_dam = dam;
	} else {
		int power = z_info->r_crit_power_weight_scl * weight
			+ randint1(z_info->r_crit_power_random);
		const struct critical_level *this_l = z_info->r_crit_level_head;

		while (power >= this_l->cutoff && this_l->next) {
			this_l = this_l->next;
		}
		*msg_type = this_l->msgt;
		new_dam = this_l->add + this_l->mult * dam;
	}

	return new_dam;
}